

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O0

Result __thiscall
wabt::interp::anon_unknown_1::BinaryReaderInterp::OnBrTableExpr
          (BinaryReaderInterp *this,Index num_targets,Index *target_depths,
          Index default_target_depth)

{
  Index index;
  Index index_00;
  bool bVar1;
  Location local_1b8;
  Enum local_194;
  Enum local_190;
  Enum local_18c;
  Location local_188;
  Var local_168;
  Location local_120;
  Enum local_fc;
  Enum local_f8;
  Enum local_f4;
  Location local_f0;
  Var local_d0;
  Location local_88;
  Enum local_68;
  Index local_64;
  uint local_60;
  Index depth;
  Index i;
  Index catch_drop_count;
  Index keep_count;
  Index drop_count;
  Enum local_30;
  Index local_2c;
  Index *pIStack_28;
  Index default_target_depth_local;
  Index *target_depths_local;
  BinaryReaderInterp *pBStack_18;
  Index num_targets_local;
  BinaryReaderInterp *this_local;
  
  local_2c = default_target_depth;
  pIStack_28 = target_depths;
  target_depths_local._4_4_ = num_targets;
  pBStack_18 = this;
  GetLocation((Location *)&keep_count,this);
  local_30 = (Enum)SharedValidator::BeginBrTable(&this->validator_,(Location *)&keep_count);
  bVar1 = Failed((Result)local_30);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    Istream::Emit(this->istream_,BrTable,target_depths_local._4_4_);
    for (local_60 = 0; local_60 < target_depths_local._4_4_; local_60 = local_60 + 1) {
      local_64 = pIStack_28[local_60];
      GetLocation(&local_88,this);
      index = local_64;
      GetLocation(&local_f0,this);
      Var::Var(&local_d0,index,&local_f0);
      local_68 = (Enum)SharedValidator::OnBrTableTarget(&this->validator_,&local_88,&local_d0);
      bVar1 = Failed((Result)local_68);
      Var::~Var(&local_d0);
      if (bVar1) {
        Result::Result((Result *)((long)&this_local + 4),Error);
        return (Result)this_local._4_4_;
      }
      local_f4 = (Enum)GetBrDropKeepCount(this,local_64,&catch_drop_count,&i);
      bVar1 = Failed((Result)local_f4);
      if (bVar1) {
        Result::Result((Result *)((long)&this_local + 4),Error);
        return (Result)this_local._4_4_;
      }
      local_f8 = (Enum)SharedValidator::GetCatchCount(&this->validator_,local_64,&depth);
      bVar1 = Failed((Result)local_f8);
      if (bVar1) {
        Result::Result((Result *)((long)&this_local + 4),Error);
        return (Result)this_local._4_4_;
      }
      Istream::Emit(this->istream_,InterpDropKeep,catch_drop_count,i);
      Istream::Emit(this->istream_,InterpCatchDrop,depth);
      EmitBr(this,local_64,0,0,0);
    }
    GetLocation(&local_120,this);
    index_00 = local_2c;
    GetLocation(&local_188,this);
    Var::Var(&local_168,index_00,&local_188);
    local_fc = (Enum)SharedValidator::OnBrTableTarget(&this->validator_,&local_120,&local_168);
    bVar1 = Failed((Result)local_fc);
    Var::~Var(&local_168);
    if (bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Error);
    }
    else {
      local_18c = (Enum)GetBrDropKeepCount(this,local_2c,&catch_drop_count,&i);
      bVar1 = Failed((Result)local_18c);
      if (bVar1) {
        Result::Result((Result *)((long)&this_local + 4),Error);
      }
      else {
        local_190 = (Enum)SharedValidator::GetCatchCount(&this->validator_,local_2c,&depth);
        bVar1 = Failed((Result)local_190);
        if (bVar1) {
          Result::Result((Result *)((long)&this_local + 4),Error);
        }
        else {
          Istream::EmitDropKeep(this->istream_,catch_drop_count,i);
          Istream::Emit(this->istream_,InterpCatchDrop,depth);
          EmitBr(this,local_2c,0,0,0);
          GetLocation(&local_1b8,this);
          local_194 = (Enum)SharedValidator::EndBrTable(&this->validator_,&local_1b8);
          bVar1 = Failed((Result)local_194);
          if (bVar1) {
            Result::Result((Result *)((long)&this_local + 4),Error);
          }
          else {
            Result::Result((Result *)((long)&this_local + 4),Ok);
          }
        }
      }
    }
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReaderInterp::OnBrTableExpr(Index num_targets,
                                         Index* target_depths,
                                         Index default_target_depth) {
  CHECK_RESULT(validator_.BeginBrTable(GetLocation()));
  Index drop_count, keep_count, catch_drop_count;
  istream_.Emit(Opcode::BrTable, num_targets);

  for (Index i = 0; i < num_targets; ++i) {
    Index depth = target_depths[i];
    CHECK_RESULT(
        validator_.OnBrTableTarget(GetLocation(), Var(depth, GetLocation())));
    CHECK_RESULT(GetBrDropKeepCount(depth, &drop_count, &keep_count));
    CHECK_RESULT(validator_.GetCatchCount(depth, &catch_drop_count));
    // Emit DropKeep directly (instead of using EmitDropKeep) so the
    // instruction has a fixed size. Same for CatchDrop as well.
    istream_.Emit(Opcode::InterpDropKeep, drop_count, keep_count);
    istream_.Emit(Opcode::InterpCatchDrop, catch_drop_count);
    EmitBr(depth, 0, 0, 0);
  }
  CHECK_RESULT(validator_.OnBrTableTarget(
      GetLocation(), Var(default_target_depth, GetLocation())));
  CHECK_RESULT(
      GetBrDropKeepCount(default_target_depth, &drop_count, &keep_count));
  CHECK_RESULT(
      validator_.GetCatchCount(default_target_depth, &catch_drop_count));
  // The default case doesn't need a fixed size, since it is never jumped over.
  istream_.EmitDropKeep(drop_count, keep_count);
  istream_.Emit(Opcode::InterpCatchDrop, catch_drop_count);
  EmitBr(default_target_depth, 0, 0, 0);

  CHECK_RESULT(validator_.EndBrTable(GetLocation()));
  return Result::Ok;
}